

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O3

void nonstd::sv_lite::detail::write_padding<std::ostream>
               (basic_ostream<char,_std::char_traits<char>_> *os,streamsize n)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  long lVar2;
  long *plVar3;
  basic_ostream<char,_std::char_traits<char>_> bVar4;
  
  if (0 < n) {
    do {
      lVar2 = *(long *)(*(long *)os + -0x18);
      pbVar1 = os + lVar2;
      plVar3 = *(long **)(os + lVar2 + 0xe8);
      if (os[lVar2 + 0xe1] == (basic_ostream<char,_std::char_traits<char>_>)0x1) {
        bVar4 = pbVar1[0xe0];
      }
      else {
        bVar4 = (basic_ostream<char,_std::char_traits<char>_>)std::ios::widen((char)pbVar1);
        pbVar1[0xe0] = bVar4;
        pbVar1[0xe1] = (basic_ostream<char,_std::char_traits<char>_>)0x1;
      }
      if ((basic_ostream<char,_std::char_traits<char>_> *)plVar3[5] <
          (basic_ostream<char,_std::char_traits<char>_> *)plVar3[6]) {
        *(basic_ostream<char,_std::char_traits<char>_> *)plVar3[5] = bVar4;
        plVar3[5] = plVar3[5] + 1;
      }
      else {
        (**(code **)(*plVar3 + 0x68))(plVar3,bVar4);
      }
      n = n + -1;
    } while (n != 0);
  }
  return;
}

Assistant:

void write_padding( Stream & os, std::streamsize n )
{
    for ( std::streamsize i = 0; i < n; ++i )
        os.rdbuf()->sputc( os.fill() );
}